

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::PopulateCustomVectors(cmCTestTestHandler *this,cmMakefile *mf)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  char *msg;
  string local_2b8 [32];
  ostringstream local_298 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_119;
  string local_118;
  cmValue local_f8;
  cmValue dval;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmCTestTestHandler *this_local;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_PRE_TEST",&local_39);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomPreTest);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CTEST_CUSTOM_POST_TEST",&local_71);
  cmCTest::PopulateCustomVector(pcVar1,pcVar2,&local_70,&this->CustomPostTest);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CTEST_CUSTOM_TESTS_IGNORE",&local_99);
  cmCTest::PopulateCustomVector(pcVar1,pcVar2,&local_98,&this->CustomTestsIgnore);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE",&local_c1);
  cmCTest::PopulateCustomInteger(pcVar1,pcVar2,&local_c0,&this->CustomMaximumPassedTestOutputSize);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE",
             (allocator<char> *)((long)&dval.Value + 7));
  cmCTest::PopulateCustomInteger(pcVar1,pcVar2,&local_e8,&this->CustomMaximumFailedTestOutputSize);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dval.Value + 7));
  pcVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION",&local_119);
  local_f8 = cmMakefile::GetDefinition(pcVar2,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  bVar3 = cmValue::operator_cast_to_bool(&local_f8);
  if (bVar3) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_f8);
    bVar3 = SetTestOutputTruncation(this,psVar4);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream(local_298);
      poVar5 = std::operator<<((ostream *)local_298,
                               "Invalid value for CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION: ");
      psVar4 = cmValue::operator*[abi_cxx11_(&local_f8);
      poVar5 = std::operator<<(poVar5,(string *)psVar4);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x17a,msg,false);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::ostringstream::~ostringstream(local_298);
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::PopulateCustomVectors(cmMakefile* mf)
{
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_PRE_TEST",
                                    this->CustomPreTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_POST_TEST",
                                    this->CustomPostTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_TESTS_IGNORE",
                                    this->CustomTestsIgnore);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE",
    this->CustomMaximumPassedTestOutputSize);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE",
    this->CustomMaximumFailedTestOutputSize);

  cmValue dval = mf->GetDefinition("CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION");
  if (dval) {
    if (!this->SetTestOutputTruncation(*dval)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Invalid value for CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION: "
                   << *dval << std::endl);
    }
  }
}